

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

void __thiscall wasm::MultiMemoryLowering::Replacer::~Replacer(Replacer *this)

{
  WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
  ::~WalkerPass(&this->
                 super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
               );
  operator_delete(this,0x140);
  return;
}

Assistant:

Replacer(MultiMemoryLowering& parent, Module& wasm)
      : parent(parent), builder(wasm) {}